

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  TestEventRepeater *pTVar1;
  bool bVar2;
  UnitTestImpl *this_00;
  OsStackTraceGetterInterface *pOVar3;
  TimeInMillis TVar4;
  TestInfo *pTVar5;
  int i;
  int i_00;
  
  if (this->should_run_ != true) {
    return;
  }
  this_00 = internal::GetUnitTestImpl();
  this_00->current_test_suite_ = this;
  UnitTest::GetInstance();
  pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[6])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1,this);
  pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar3->_vptr_OsStackTraceGetterInterface[3])(pOVar3);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x12339e,(char *)0x0);
  TVar4 = internal::GetTimeInMillis();
  this->start_timestamp_ = TVar4;
  for (i_00 = 1; i = i_00 + -1,
      i < (int)((ulong)((long)(this->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->test_info_list_).
                             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1) {
    pTVar5 = GetMutableTestInfo(this,i);
    TestInfo::Run(pTVar5);
    if (FLAGS_gtest_fail_fast == '\x01') {
      pTVar5 = GetMutableTestInfo(this,i);
      bVar2 = TestResult::Failed(&pTVar5->result_);
      if (bVar2) goto LAB_00113ece;
    }
  }
LAB_00113edf:
  TVar4 = internal::GetTimeInMillis();
  this->elapsed_time_ = TVar4 - this->start_timestamp_;
  pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(this_00);
  (*pOVar3->_vptr_OsStackTraceGetterInterface[3])(pOVar3);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>(this,0x1233aa,(char *)0x0);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xb])(pTVar1,this);
  (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar1,this);
  this_00->current_test_suite_ = (TestSuite *)0x0;
  return;
LAB_00113ece:
  for (; i_00 < (int)((ulong)((long)(this->test_info_list_).
                                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->test_info_list_).
                                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3); i_00 = i_00 + 1
      ) {
    pTVar5 = GetMutableTestInfo(this,i_00);
    TestInfo::Skip(pTVar5);
  }
  goto LAB_00113edf;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  start_timestamp_ = internal::GetTimeInMillis();
  for (int i = 0; i < total_test_count(); i++) {
    GetMutableTestInfo(i)->Run();
    if (GTEST_FLAG(fail_fast) && GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = internal::GetTimeInMillis() - start_timestamp_;

  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  impl->set_current_test_suite(nullptr);
}